

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

void write_num_bytes(CVmDataSource *dst,char *buf,CVmPackType *t,size_t len)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  if (((1 < len) && (t->big_endian != 0)) && (uVar2 = (int)len - 1, 0 < (int)uVar2)) {
    lVar6 = 0;
    uVar5 = (ulong)uVar2;
    do {
      uVar4 = uVar5 - 1;
      cVar1 = buf[lVar6];
      buf[lVar6] = buf[uVar5];
      buf[uVar5] = cVar1;
      lVar6 = lVar6 + 1;
      uVar5 = uVar4;
    } while (lVar6 < (long)uVar4);
  }
  iVar3 = (*dst->_vptr_CVmDataSource[4])(dst,buf,len);
  if (iVar3 == 0) {
    return;
  }
  err_throw(0x66);
}

Assistant:

static void write_num_bytes(class CVmDataSource *dst,
                            char *buf, const CVmPackType *t, size_t len)
{
    /* 
     *   we always prepare our buffers in our standard little-endian byte
     *   order, so if the type has a big-endian flag, we need to reverse the
     *   byte order
     */
    if (len > 1 && t->big_endian)
        reverse_bytes(buf, len);

    /* write the bytes */
    if (dst->write(buf, len))
        err_throw(VMERR_WRITE_FILE);
}